

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

void __thiscall
gl3cts::ReservedNamesTest::ReservedNamesTest(ReservedNamesTest *this,Context *context)

{
  Context *context_local;
  ReservedNamesTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"CommonBug_ReservedNames",
             "Verifies that reserved variable names are rejected by the GL SL compiler at the compilation time."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ReservedNamesTest_0323dc80;
  this->m_max_fs_ssbos = 0;
  this->m_max_gs_acs = 0;
  this->m_max_gs_ssbos = 0;
  this->m_max_tc_acs = 0;
  this->m_max_tc_ssbos = 0;
  this->m_max_te_acs = 0;
  this->m_max_te_ssbos = 0;
  this->m_max_vs_acs = 0;
  this->m_max_vs_ssbos = 0;
  memset(this->m_so_ids,0,0x18);
  return;
}

Assistant:

ReservedNamesTest::ReservedNamesTest(deqp::Context& context)
	: TestCase(context, "CommonBug_ReservedNames",
			   "Verifies that reserved variable names are rejected by the GL SL compiler"
			   " at the compilation time.")
	, m_max_fs_ssbos(0)
	, m_max_gs_acs(0)
	, m_max_gs_ssbos(0)
	, m_max_tc_acs(0)
	, m_max_tc_ssbos(0)
	, m_max_te_acs(0)
	, m_max_te_ssbos(0)
	, m_max_vs_acs(0)
	, m_max_vs_ssbos(0)
{
	memset(m_so_ids, 0, sizeof(m_so_ids));
}